

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_cr.c
# Opt level: O3

void byte_copyr(char *to,uint n,char *from)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  
  if (n != 0) {
    pcVar1 = from + -1;
    pcVar2 = to + -1;
    uVar3 = 0;
    do {
      pcVar2[n] = pcVar1[n];
      if (n - 1 == uVar3) {
        return;
      }
      pcVar2[(ulong)n - 1] = pcVar1[(ulong)n - 1];
      if (n - 2 == uVar3) {
        return;
      }
      pcVar2[(ulong)n - 2] = pcVar1[(ulong)n - 2];
      if (n - 3 == uVar3) {
        return;
      }
      pcVar2[(ulong)n - 3] = pcVar1[(ulong)n - 3];
      pcVar1 = pcVar1 + -4;
      uVar3 = uVar3 + 4;
      pcVar2 = pcVar2 + -4;
    } while (n != uVar3);
  }
  return;
}

Assistant:

void byte_copyr(to,n,from)
register char *to;
register unsigned int n;
register char *from;
{
  to += n;
  from += n;
  for (;;) {
    if (!n) return; *--to = *--from; --n;
    if (!n) return; *--to = *--from; --n;
    if (!n) return; *--to = *--from; --n;
    if (!n) return; *--to = *--from; --n;
  }
}